

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  int iVar1;
  LogMessage LStack_18;
  
  if (this->is_repeated == false) {
    GetSize();
  }
  else if (0xed < (byte)(this->type - 0x13)) {
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      iVar1 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      return iVar1;
    case 9:
    case 10:
      return *(int *)((this->field_0).int64_t_value + 8);
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x65a);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_18,(char (*) [16])"Can\'t get here.");
    }
    goto LAB_00401c88;
  }
  GetSize();
LAB_00401c88:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  ABSL_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return ptr.repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return 0;
}